

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternBuilder.cpp
# Opt level: O2

void __thiscall
PatternBuilder::PatternBuilder(PatternBuilder *this,HammeringPattern *hammering_pattern)

{
  uint uVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2728;
  undefined1 local_13a0 [8];
  random_device rd;
  
  this->pattern = hammering_pattern;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->gen);
  this->aggressor_id_counter = 1;
  std::random_device::random_device((random_device *)local_13a0);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_2728,(ulong)uVar1);
  memcpy(&this->gen,&local_2728,5000);
  std::random_device::~random_device((random_device *)local_13a0);
  return;
}

Assistant:

PatternBuilder::PatternBuilder(HammeringPattern &hammering_pattern)
    : pattern(hammering_pattern), aggressor_id_counter(1) {
  std::random_device rd;
  gen = std::mt19937(rd());
}